

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

iteration_time __thiscall
helics::CommonCore::requestTimeIterative
          (CommonCore *this,LocalFederateId federateID,Time next,IterationRequest iterate)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  FederateStates FVar2;
  int32_t iVar3;
  undefined8 uVar4;
  char in_CL;
  ActionMessage *this_00;
  baseType in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  CommonCore *in_RDI;
  iteration_time iVar5;
  ActionMessage treq;
  ActionMessage terminate;
  BrokerState cBrokerState;
  FederateState *fed;
  undefined1 in_stack_0000069e;
  IterationRequest in_stack_0000069f;
  FederateState *in_stack_000006a0;
  Time in_stack_000006a8;
  undefined7 in_stack_fffffffffffffda8;
  IterationRequest in_stack_fffffffffffffdaf;
  FederateState *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  memory_order __m;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdcc;
  undefined1 *puVar6;
  char *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdf0;
  ActionMessage local_1f0;
  BaseType local_128;
  BaseType local_124;
  undefined1 local_120 [8];
  BaseType local_118;
  BaseType local_110;
  BrokerState local_62;
  FederateState *local_38;
  char local_29;
  baseType local_20;
  Time local_10;
  IterationResult local_8;
  
  local_29 = in_CL;
  local_20 = in_RDX;
  local_38 = getFederateAt(in_RDI,(LocalFederateId)
                                  (BaseType)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  if (local_38 == (FederateState *)0x0) {
    uVar4 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffdc0,
               (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    message._M_len._4_4_ = in_stack_fffffffffffffdcc;
    message._M_len._0_4_ = in_stack_fffffffffffffdc8;
    message._M_str = in_stack_fffffffffffffdd0;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffdc0,message);
    __cxa_throw(uVar4,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  bVar1 = FederateState::isCallbackFederate(local_38);
  if (!bVar1) {
    FVar2 = FederateState::getState((FederateState *)0x4916db);
    this_00 = (ActionMessage *)(ulong)FVar2;
    switch(this_00) {
    case (ActionMessage *)0x0:
    case (ActionMessage *)0x1:
      local_10.internalTimeCode = 0;
      local_8 = ERROR_RESULT;
      uVar4 = extraout_RDX;
      break;
    case (ActionMessage *)0x2:
    default:
      if ((local_29 == '\x02') &&
         (iVar3 = FederateState::getCurrentIteration((FederateState *)0x491765),
         (in_RDI->super_BrokerBase).maxIterationCount <= iVar3)) {
        local_29 = '\0';
      }
      local_62 = BrokerBase::getBrokerState((BrokerBase *)0x491787);
      puVar6 = (undefined1 *)((ulong)in_stack_fffffffffffffdcc << 0x20);
      if ((ushort)(local_62 + CONNECTED) < 5) {
        puVar6 = local_120;
        ActionMessage::ActionMessage(this_00,(action_t)((ulong)puVar6 >> 0x20));
        local_124 = (BaseType)
                    std::atomic::operator_cast_to_GlobalFederateId
                              ((atomic<helics::GlobalFederateId> *)
                               CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
        local_110 = local_124;
        local_128 = (BaseType)
                    std::atomic::operator_cast_to_GlobalFederateId
                              ((atomic<helics::GlobalFederateId> *)
                               CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
        local_118 = local_128;
        FederateState::addAction
                  (in_stack_fffffffffffffdb0,
                   (ActionMessage *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffdb0);
      }
      ActionMessage::ActionMessage(this_00,(action_t)((ulong)puVar6 >> 0x20));
      __m = seq_cst;
      local_1f0.source_id =
           std::atomic<helics::GlobalFederateId>::load(&local_38->global_id,seq_cst);
      local_1f0.dest_id = std::atomic<helics::GlobalFederateId>::load(&local_38->global_id,__m);
      local_1f0.actionTime.internalTimeCode = local_20;
      setIterationFlags((ActionMessage *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdaf);
      setActionFlag<helics::ActionMessage,helics::GeneralFlags>(&local_1f0,indicator_flag);
      BrokerBase::addActionMessage
                ((BrokerBase *)in_stack_fffffffffffffdb0,
                 (ActionMessage *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
      iVar5 = FederateState::requestTime
                        (in_stack_000006a0,in_stack_000006a8,in_stack_0000069f,
                         (bool)in_stack_0000069e);
      local_10 = iVar5.grantedTime.internalTimeCode;
      local_8 = iVar5.state;
      ActionMessage::~ActionMessage((ActionMessage *)local_10.internalTimeCode);
      uVar4 = extraout_RDX_02;
      break;
    case (ActionMessage *)0x3:
    case (ActionMessage *)0x5:
      local_10.internalTimeCode = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
      local_8 = HALTED;
      uVar4 = extraout_RDX_00;
      break;
    case (ActionMessage *)0x4:
    case (ActionMessage *)0x6:
      local_10.internalTimeCode = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
      local_8 = ERROR_RESULT;
      uVar4 = extraout_RDX_01;
    }
    iVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
    iVar5.state = local_8;
    iVar5.grantedTime.internalTimeCode = local_10.internalTimeCode;
    return iVar5;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffdc0,
             (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  message_00._M_len._4_4_ = in_stack_fffffffffffffdcc;
  message_00._M_len._0_4_ = in_stack_fffffffffffffdc8;
  message_00._M_str = in_stack_fffffffffffffdd0;
  InvalidFunctionCall::InvalidFunctionCall
            ((InvalidFunctionCall *)in_stack_fffffffffffffdc0,message_00);
  __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
}

Assistant:

iteration_time CommonCore::requestTimeIterative(LocalFederateId federateID,
                                                Time next,
                                                IterationRequest iterate)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid timeRequestIterative"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "Time request iterative operation is not permitted for callback based federates"));
    }
    switch (fed->getState()) {
        case FederateStates::EXECUTING:
            break;
        case FederateStates::FINISHED:
        case FederateStates::TERMINATING:
            return iteration_time{Time::maxVal(), IterationResult::HALTED};
        case FederateStates::CREATED:
        case FederateStates::INITIALIZING:
            return iteration_time{timeZero, IterationResult::ERROR_RESULT};
        case FederateStates::UNKNOWN:
        case FederateStates::ERRORED:
            return iteration_time{Time::maxVal(), IterationResult::ERROR_RESULT};
    }

    // limit the iterations
    if (iterate == IterationRequest::ITERATE_IF_NEEDED) {
        if (fed->getCurrentIteration() >= maxIterationCount) {
            iterate = IterationRequest::NO_ITERATIONS;
        }
    }

    auto cBrokerState = getBrokerState();
    switch (cBrokerState) {
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATED:
        case BrokerState::CONNECTED_ERROR:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage terminate(CMD_STOP);
            terminate.dest_id = fed->global_id;
            terminate.source_id = fed->global_id;
            fed->addAction(terminate);
        } break;
        default:
            break;
    }
    // generate the request through the core
    ActionMessage treq(CMD_TIME_REQUEST);
    treq.source_id = fed->global_id.load();
    treq.dest_id = fed->global_id.load();
    treq.actionTime = next;
    setIterationFlags(treq, iterate);
    setActionFlag(treq, indicator_flag);
    addActionMessage(treq);

    return fed->requestTime(next, iterate, false);
}